

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkSets.c
# Opt level: O2

uint Lpk_ComputeSets_rec(Kit_DsdNtk_t *p,int iLit,Vec_Int_t *vSets)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Kit_DsdObj_t *pKVar4;
  Kit_DsdObj_t KVar5;
  uint Entry;
  ulong uVar6;
  uint uSupps [16];
  
  iVar1 = Abc_Lit2Var(iLit);
  pKVar4 = Kit_DsdNtkObj(p,iVar1);
  if (pKVar4 == (Kit_DsdObj_t *)0x0) {
    iVar1 = Abc_Lit2Var(iLit);
    uVar2 = 1 << ((byte)iVar1 & 0x1f);
  }
  else {
    KVar5 = *pKVar4;
    uVar2 = (uint)KVar5 >> 6 & 7;
    if (uVar2 - 3 < 2) {
      uVar2 = 0;
      for (uVar6 = 0; uVar6 < (uint)KVar5 >> 0x1a; uVar6 = uVar6 + 1) {
        uVar3 = Lpk_ComputeSets_rec(p,(uint)*(ushort *)(&pKVar4[1].field_0x0 + uVar6 * 2),vSets);
        uSupps[uVar6] = uVar3;
        uVar2 = uVar2 | uVar3;
        KVar5 = *pKVar4;
      }
      for (uVar3 = 1; uVar3 < (uint)~(-1 << (KVar5._3_1_ >> 2 & 0x1f)); uVar3 = uVar3 + 1) {
        Entry = 0;
        for (uVar6 = 0; (uint)*pKVar4 >> 0x1a != uVar6; uVar6 = uVar6 + 1) {
          if ((uVar3 >> ((uint)uVar6 & 0x1f) & 1) != 0) {
            Entry = Entry | uSupps[uVar6];
          }
        }
        Vec_IntPush(vSets,Entry);
      }
    }
    else {
      if (uVar2 != 5) {
        __assert_fail("pObj->Type == KIT_DSD_PRIME",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkSets.c"
                      ,0x55,"unsigned int Lpk_ComputeSets_rec(Kit_DsdNtk_t *, int, Vec_Int_t *)");
      }
      uVar2 = 0;
      for (uVar6 = 0; uVar6 < (uint)KVar5 >> 0x1a; uVar6 = uVar6 + 1) {
        uVar3 = Lpk_ComputeSets_rec(p,(uint)*(ushort *)(&pKVar4[1].field_0x0 + uVar6 * 2),vSets);
        uVar2 = uVar2 | uVar3;
        Vec_IntPush(vSets,uVar3);
        KVar5 = *pKVar4;
      }
    }
  }
  return uVar2;
}

Assistant:

unsigned Lpk_ComputeSets_rec( Kit_DsdNtk_t * p, int iLit, Vec_Int_t * vSets )
{
    unsigned i, iLitFanin, uSupport, uSuppCur;
    Kit_DsdObj_t * pObj;
    // consider the case of simple gate
    pObj = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit) );
    if ( pObj == NULL )
        return (1 << Abc_Lit2Var(iLit));
    if ( pObj->Type == KIT_DSD_AND || pObj->Type == KIT_DSD_XOR )
    {
        unsigned uSupps[16], Limit, s;
        uSupport = 0;
        Kit_DsdObjForEachFanin( p, pObj, iLitFanin, i )
        {
            uSupps[i] = Lpk_ComputeSets_rec( p, iLitFanin, vSets );
            uSupport |= uSupps[i];
        }
        // create all subsets, except empty and full
        Limit = (1 << pObj->nFans) - 1;
        for ( s = 1; s < Limit; s++ )
        {
            uSuppCur = 0;
            for ( i = 0; i < pObj->nFans; i++ )
                if ( s & (1 << i) )
                    uSuppCur |= uSupps[i];
            Vec_IntPush( vSets, uSuppCur );
        }
        return uSupport;
    }
    assert( pObj->Type == KIT_DSD_PRIME );
    // get the cumulative support of all fanins
    uSupport = 0;
    Kit_DsdObjForEachFanin( p, pObj, iLitFanin, i )
    {
        uSuppCur  = Lpk_ComputeSets_rec( p, iLitFanin, vSets );
        uSupport |= uSuppCur;
        Vec_IntPush( vSets, uSuppCur );
    }
    return uSupport;
}